

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

void __thiscall cppcms::widgets::submit::submit(submit *this)

{
  basic_message<char> *in_RDI;
  string *in_stack_ffffffffffffffc0;
  void **in_stack_ffffffffffffffc8;
  base_html_input *in_stack_ffffffffffffffd0;
  string local_28 [24];
  base_widget *in_stack_fffffffffffffff0;
  
  base_widget::base_widget(in_stack_fffffffffffffff0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"submit",(allocator *)&stack0xffffffffffffffd7);
  base_html_input::base_html_input
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd7);
  *(undefined ***)in_RDI = &PTR__submit_0052ce88;
  *(undefined ***)&in_RDI[1].context_ = &PTR_render_0052cf08;
  booster::hold_ptr<cppcms::widgets::submit::_data>::hold_ptr
            ((hold_ptr<cppcms::widgets::submit::_data> *)
             &(in_RDI->id_).field_2._M_allocated_capacity);
  (in_RDI->id_).field_2._M_local_buf[8] = '\0';
  booster::locale::basic_message<char>::basic_message(in_RDI);
  base_widget::set((base_widget *)((long)&in_RDI->n_ + *(long *)(*(long *)in_RDI + -0x18)),true);
  return;
}

Assistant:

submit::submit() : 
	base_html_input("submit"),
	pressed_(false)
{
	set(true);
}